

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

void __thiscall LFPConsumer::initialize(LFPConsumer *this)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int i;
  int local_54;
  HFParsingInfo *local_50;
  vector<int,_std::allocator<int>_> newindices;
  
  newindices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  newindices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  newindices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_50 = &this->args;
  piVar1 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar2 = -2;
  for (piVar3 = (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    i = *piVar3;
    if (i - iVar2 == 1) {
      newindices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish[-1] =
           newindices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish[-1] + 1;
    }
    else {
      std::vector<int,_std::allocator<int>_>::push_back(&newindices,&i);
      local_54 = 1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&newindices,&local_54);
    }
    iVar2 = i;
  }
  std::vector<int,_std::allocator<int>_>::operator=(&local_50->indices,&newindices);
  iVar2 = HighFreqDataType::getByteSize(&(this->super_HFSubConsumer).super_HighFreqSub.dt);
  std::vector<short,_std::allocator<short>_>::resize(&this->temp,(ulong)(long)iVar2 >> 1);
  HFSubConsumer::initialize(&this->super_HFSubConsumer);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&newindices.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void LFPConsumer::initialize(){
    //indices are list of indices for each ntrode requested
    //Here, convert into {startbyte, len} so that nearby indices are collapsed
    std::vector<int> newindices;
    int prev = -2;
    for(auto const i : args.indices){
        if(i-prev == 1){//If i is right after the previous index
            newindices.back()++;
        }
        else{//else its a new separate grouping
            newindices.push_back(i);
            newindices.push_back(1);
        }
        prev = i;
    }
    // for(auto const i : newindices) std::cout << "-i" << i;
    // std::cout << std::endl;
    args.indices = newindices;
    // std::cout << std::endl;
    temp.resize(dt.getByteSize()/sizeof(int16_t));
    HFSubConsumer::initialize();
}